

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void on_nes_audio(nes_audio_output *audio,void *client)

{
  float fVar1;
  uint local_42c;
  uint32_t src;
  float diff;
  float increment_rate;
  float target_latency;
  uint32_t dst;
  int16_t resample_buf [512];
  void *client_local;
  nes_audio_output *audio_local;
  
  increment_rate = 0.0;
  resample_buf._1016_8_ = client;
  SDL_LockAudioDevice(audio_device_id);
  src = (uint32_t)(44100.0 / (float)audio->sample_rate);
  fVar1 = ABS(60.0 - latency_avg);
  if (3.0 < fVar1) {
    if (60.0 <= latency_avg) {
      src = (uint32_t)((float)src - fVar1 / 44100.0);
    }
    else {
      src = (uint32_t)(fVar1 / 44100.0 + (float)src);
    }
  }
  for (local_42c = 0; local_42c < audio->sample_count; local_42c = local_42c + 1) {
    if (1.0 <= audio_counter) {
      audio_counter = audio_counter - 1.0;
      *(int16_t *)((long)&target_latency + (ulong)(uint)increment_rate * 2) =
           audio->samples[local_42c];
      increment_rate = (float)((int)increment_rate + 1);
    }
    audio_counter = (float)src + audio_counter;
    if (increment_rate == 7.17465e-43) {
      ring_buf_write(&audio_ring_buf,&target_latency,0x400);
      increment_rate = 0.0;
    }
  }
  if (increment_rate != 0.0) {
    ring_buf_write(&audio_ring_buf,&target_latency,(ulong)(uint)increment_rate << 1);
  }
  SDL_UnlockAudioDevice(audio_device_id);
  return;
}

Assistant:

void on_nes_audio(const nes_audio_output* audio, void* client)
{
    int16_t resample_buf[512];
    uint32_t dst = 0;

    SDL_LockAudioDevice(audio_device_id);

    const float target_latency = 60.f;
    float increment_rate = (float)SAMPLE_RATE / (float)audio->sample_rate;

    float diff = fabsf(target_latency - latency_avg);
    if (diff > 3.0f)
    {
        if (latency_avg < target_latency)
            increment_rate += diff / (float)SAMPLE_RATE;
        else
            increment_rate -= diff / (float)SAMPLE_RATE;
    }

    for (uint32_t src = 0; src < audio->sample_count; ++src)
    {
        if (audio_counter >= 1.0f)
        {
            audio_counter -= 1.0f;
            resample_buf[dst++] = audio->samples[src];
        }
        audio_counter += increment_rate;

        if (dst == 512)
        {
            ring_buf_write(&audio_ring_buf, resample_buf, dst * sizeof(int16_t));
            dst = 0;
        }
    }

    if (dst)
        ring_buf_write(&audio_ring_buf, resample_buf, dst * sizeof(int16_t));

    SDL_UnlockAudioDevice(audio_device_id);
}